

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O1

void __thiscall
QTableWidgetPrivate::emitCurrentItemChanged
          (QTableWidgetPrivate *this,QModelIndex *current,QModelIndex *previous)

{
  QObject *this_00;
  QTableModel *pQVar1;
  QTableWidgetItem *pQVar2;
  QTableWidgetItem *pQVar3;
  long in_FS_OFFSET;
  QTableWidgetItem *local_68;
  QTableWidgetItem *local_60;
  void *local_58;
  QTableWidgetItem **ppQStack_50;
  undefined1 *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QObject **)
             &(this->super_QTableViewPrivate).super_QAbstractItemViewPrivate.
              super_QAbstractScrollAreaPrivate.super_QFramePrivate.super_QWidgetPrivate.field_0x8;
  pQVar1 = (QTableModel *)QMetaObject::cast((QObject *)&QTableModel::staticMetaObject);
  pQVar2 = QTableModel::item(pQVar1,current);
  pQVar1 = (QTableModel *)QMetaObject::cast((QObject *)&QTableModel::staticMetaObject);
  pQVar3 = QTableModel::item(pQVar1,previous);
  if (pQVar2 != (QTableWidgetItem *)0x0 || pQVar3 != (QTableWidgetItem *)0x0) {
    ppQStack_50 = &local_60;
    local_58 = (void *)0x0;
    local_68 = pQVar3;
    local_60 = pQVar2;
    local_48 = (undefined1 *)&local_68;
    QMetaObject::activate(this_00,&QTableWidget::staticMetaObject,6,&local_58);
  }
  QTableWidget::currentCellChanged
            ((QTableWidget *)this_00,current->r,current->c,previous->r,previous->c);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTableWidgetPrivate::emitCurrentItemChanged(const QModelIndex &current,
                                                 const QModelIndex &previous)
{
    Q_Q(QTableWidget);
    QTableWidgetItem *currentItem = tableModel()->item(current);
    QTableWidgetItem *previousItem = tableModel()->item(previous);
    if (currentItem || previousItem)
        emit q->currentItemChanged(currentItem, previousItem);
    emit q->currentCellChanged(current.row(), current.column(), previous.row(), previous.column());
}